

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<std::complex<double>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *rhs)

{
  double dVar1;
  complex<double> *pcVar2;
  complex<double> *__s;
  long lVar3;
  long lVar4;
  ulong __n;
  long lVar5;
  long local_60;
  long local_58;
  long local_50;
  double local_48;
  double dStack_40;
  
  lVar3 = this->size_;
  if (lVar3 != rhs->size_) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<double>>::operator*=(const SquareMatrix<T> &) [T = std::complex<double>]"
                 );
  }
  if (lVar3 != 0) {
    __n = lVar3 * lVar3 * 0x10;
    __s = (complex<double> *)operator_new__(-(ulong)((ulong)(lVar3 * lVar3) >> 0x3c != 0) | __n);
    memset(__s,0,__n);
    if (0 < this->size_) {
      local_50 = 0;
      local_58 = 0;
      do {
        if (0 < this->size_) {
          local_60 = 0;
          do {
            lVar3 = this->size_;
            if (0 < lVar3) {
              lVar5 = 0;
              lVar4 = 0;
              do {
                pcVar2 = (this->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                         lVar3 * lVar4 + local_60;
                local_48 = *(double *)pcVar2->_M_value;
                dStack_40 = *(double *)(pcVar2->_M_value + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_48,
                           (complex<double> *)
                           (((rhs->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                            _M_value + lVar5 + rhs->size_ * local_50));
                lVar3 = this->size_ * local_58;
                dVar1 = *(double *)((long)__s[local_60 + lVar3]._M_value + 8);
                *(double *)__s[local_60 + lVar3]._M_value =
                     local_48 + *(double *)__s[local_60 + lVar3]._M_value;
                *(double *)((long)__s[local_60 + lVar3]._M_value + 8) = dStack_40 + dVar1;
                lVar4 = lVar4 + 1;
                lVar3 = this->size_;
                lVar5 = lVar5 + 0x10;
              } while (lVar4 < lVar3);
            }
            local_60 = local_60 + 1;
          } while (local_60 < this->size_);
        }
        local_58 = local_58 + 1;
        local_50 = local_50 + 0x10;
      } while (local_58 < this->size_);
    }
    pcVar2 = (this->data_)._M_t.
             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = __s;
    if (pcVar2 != (complex<double> *)0x0) {
      operator_delete__(pcVar2);
    }
    return this;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                ,0x1e,
                "auto qclab::dense::init_unique_array(const int64_t) [T = std::complex<double>]");
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }